

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  AABBNodeMB4D *node1;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  RTCIntersectFunctionN p_Var8;
  ulong uVar9;
  undefined4 uVar10;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  int mask_1;
  ulong local_8f0;
  ulong local_8e8;
  ulong local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  NodeRef *local_8c0;
  RayQueryContext *local_8b8;
  Scene *local_8b0;
  ulong local_8a8;
  RTCIntersectFunctionNArguments local_8a0;
  Geometry *local_870;
  undefined8 local_868;
  RTCIntersectArguments *local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_8c0 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar4 = (ray->dir).field_0;
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx((undefined1  [16])aVar4,auVar21);
      auVar38._8_4_ = 0x219392ef;
      auVar38._0_8_ = 0x219392ef219392ef;
      auVar38._12_4_ = 0x219392ef;
      auVar21 = vcmpps_avx(auVar21,auVar38,1);
      auVar21 = vblendvps_avx((undefined1  [16])aVar4,auVar38,auVar21);
      auVar38 = vrcpps_avx(auVar21);
      fVar30 = auVar38._0_4_;
      auVar24._0_4_ = fVar30 * auVar21._0_4_;
      fVar35 = auVar38._4_4_;
      auVar24._4_4_ = fVar35 * auVar21._4_4_;
      fVar36 = auVar38._8_4_;
      auVar24._8_4_ = fVar36 * auVar21._8_4_;
      fVar37 = auVar38._12_4_;
      auVar24._12_4_ = fVar37 * auVar21._12_4_;
      auVar39._8_4_ = 0x3f800000;
      auVar39._0_8_ = &DAT_3f8000003f800000;
      auVar39._12_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar39,auVar24);
      auVar25._0_4_ = fVar30 + fVar30 * auVar21._0_4_;
      auVar25._4_4_ = fVar35 + fVar35 * auVar21._4_4_;
      auVar25._8_4_ = fVar36 + fVar36 * auVar21._8_4_;
      auVar25._12_4_ = fVar37 + fVar37 * auVar21._12_4_;
      uVar10 = *(undefined4 *)&(ray->org).field_0;
      local_7e8._4_4_ = uVar10;
      local_7e8._0_4_ = uVar10;
      local_7e8._8_4_ = uVar10;
      local_7e8._12_4_ = uVar10;
      auVar43 = ZEXT1664(local_7e8);
      uVar10 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_7f8._4_4_ = uVar10;
      local_7f8._0_4_ = uVar10;
      local_7f8._8_4_ = uVar10;
      local_7f8._12_4_ = uVar10;
      auVar44 = ZEXT1664(local_7f8);
      uVar10 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_808._4_4_ = uVar10;
      local_808._0_4_ = uVar10;
      local_808._8_4_ = uVar10;
      local_808._12_4_ = uVar10;
      auVar45 = ZEXT1664(local_808);
      local_818 = vshufps_avx(auVar25,auVar25,0);
      auVar46 = ZEXT1664(local_818);
      auVar21 = vmovshdup_avx(auVar25);
      local_828 = vshufps_avx(auVar25,auVar25,0x55);
      auVar47 = ZEXT1664(local_828);
      auVar38 = vshufpd_avx(auVar25,auVar25,1);
      uVar12 = (ulong)(auVar25._0_4_ < 0.0) << 4;
      local_838 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar48 = ZEXT1664(local_838);
      uVar13 = (ulong)(auVar21._0_4_ < 0.0) << 4 | 0x20;
      uVar14 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x40;
      uVar15 = uVar12 ^ 0x10;
      uVar18 = uVar13 ^ 0x10;
      uVar11 = uVar14 ^ 0x10;
      local_848 = vshufps_avx(auVar22,auVar22,0);
      auVar42 = ZEXT1664(local_848);
      local_858 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar49 = ZEXT1664(local_858);
      local_8f0 = uVar11;
      local_8e8 = uVar18;
      local_8e0 = uVar15;
      local_8d8 = uVar14;
      local_8d0 = uVar13;
      local_8c8 = uVar12;
      local_8b8 = context;
      do {
        if (local_8c0 == stack) {
          return;
        }
        sVar16 = local_8c0[-1].ptr;
        local_8c0 = local_8c0 + -1;
        do {
          if ((sVar16 & 8) == 0) {
            uVar5 = sVar16 & 0xfffffffffffffff0;
            fVar3 = (ray->dir).field_0.m128[3];
            auVar20._4_4_ = fVar3;
            auVar20._0_4_ = fVar3;
            auVar20._8_4_ = fVar3;
            auVar20._12_4_ = fVar3;
            pfVar2 = (float *)(uVar5 + 0x80 + uVar12);
            pfVar1 = (float *)(uVar5 + 0x20 + uVar12);
            auVar22._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar22._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar22._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar22._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar21 = vsubps_avx(auVar22,auVar43._0_16_);
            auVar23._0_4_ = auVar46._0_4_ * auVar21._0_4_;
            auVar23._4_4_ = auVar46._4_4_ * auVar21._4_4_;
            auVar23._8_4_ = auVar46._8_4_ * auVar21._8_4_;
            auVar23._12_4_ = auVar46._12_4_ * auVar21._12_4_;
            auVar21 = vmaxps_avx(auVar42._0_16_,auVar23);
            pfVar2 = (float *)(uVar5 + 0x80 + uVar13);
            pfVar1 = (float *)(uVar5 + 0x20 + uVar13);
            auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar22 = vsubps_avx(auVar26,auVar44._0_16_);
            auVar27._0_4_ = auVar47._0_4_ * auVar22._0_4_;
            auVar27._4_4_ = auVar47._4_4_ * auVar22._4_4_;
            auVar27._8_4_ = auVar47._8_4_ * auVar22._8_4_;
            auVar27._12_4_ = auVar47._12_4_ * auVar22._12_4_;
            pfVar2 = (float *)(uVar5 + 0x80 + uVar14);
            pfVar1 = (float *)(uVar5 + 0x20 + uVar14);
            auVar31._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar31._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar31._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar31._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar22 = vsubps_avx(auVar31,auVar45._0_16_);
            auVar32._0_4_ = auVar48._0_4_ * auVar22._0_4_;
            auVar32._4_4_ = auVar48._4_4_ * auVar22._4_4_;
            auVar32._8_4_ = auVar48._8_4_ * auVar22._8_4_;
            auVar32._12_4_ = auVar48._12_4_ * auVar22._12_4_;
            auVar22 = vmaxps_avx(auVar27,auVar32);
            auVar21 = vmaxps_avx(auVar21,auVar22);
            pfVar2 = (float *)(uVar5 + 0x80 + uVar15);
            pfVar1 = (float *)(uVar5 + 0x20 + uVar15);
            auVar28._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar28._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar28._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar28._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar22 = vsubps_avx(auVar28,auVar43._0_16_);
            auVar29._0_4_ = auVar46._0_4_ * auVar22._0_4_;
            auVar29._4_4_ = auVar46._4_4_ * auVar22._4_4_;
            auVar29._8_4_ = auVar46._8_4_ * auVar22._8_4_;
            auVar29._12_4_ = auVar46._12_4_ * auVar22._12_4_;
            pfVar2 = (float *)(uVar5 + 0x80 + uVar18);
            auVar22 = vminps_avx(auVar49._0_16_,auVar29);
            pfVar1 = (float *)(uVar5 + 0x20 + uVar18);
            auVar33._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar33._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar33._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar33._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar38 = vsubps_avx(auVar33,auVar44._0_16_);
            pfVar2 = (float *)(uVar5 + 0x80 + uVar11);
            pfVar1 = (float *)(uVar5 + 0x20 + uVar11);
            auVar40._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar40._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar40._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar40._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar34._0_4_ = auVar47._0_4_ * auVar38._0_4_;
            auVar34._4_4_ = auVar47._4_4_ * auVar38._4_4_;
            auVar34._8_4_ = auVar47._8_4_ * auVar38._8_4_;
            auVar34._12_4_ = auVar47._12_4_ * auVar38._12_4_;
            auVar38 = vsubps_avx(auVar40,auVar45._0_16_);
            auVar41._0_4_ = auVar48._0_4_ * auVar38._0_4_;
            auVar41._4_4_ = auVar48._4_4_ * auVar38._4_4_;
            auVar41._8_4_ = auVar48._8_4_ * auVar38._8_4_;
            auVar41._12_4_ = auVar48._12_4_ * auVar38._12_4_;
            auVar38 = vminps_avx(auVar34,auVar41);
            auVar22 = vminps_avx(auVar22,auVar38);
            if (((uint)sVar16 & 7) == 6) {
              auVar22 = vcmpps_avx(auVar21,auVar22,2);
              auVar21 = vcmpps_avx(*(undefined1 (*) [16])(uVar5 + 0xe0),auVar20,2);
              auVar38 = vcmpps_avx(auVar20,*(undefined1 (*) [16])(uVar5 + 0xf0),1);
              auVar21 = vandps_avx(auVar21,auVar38);
              auVar21 = vandps_avx(auVar21,auVar22);
            }
            else {
              auVar21 = vcmpps_avx(auVar21,auVar22,2);
            }
            auVar21 = vpslld_avx(auVar21,0x1f);
            uVar10 = vmovmskps_avx(auVar21);
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar10);
          }
          if ((sVar16 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar17 = 4;
            }
            else {
              uVar5 = sVar16 & 0xfffffffffffffff0;
              lVar7 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              iVar17 = 0;
              sVar16 = *(size_t *)(uVar5 + lVar7 * 8);
              uVar9 = unaff_RBX - 1 & unaff_RBX;
              if (uVar9 != 0) {
                local_8c0->ptr = sVar16;
                lVar7 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar6 = uVar9 - 1;
                while( true ) {
                  local_8c0 = local_8c0 + 1;
                  sVar16 = *(size_t *)(uVar5 + lVar7 * 8);
                  uVar6 = uVar6 & uVar9;
                  if (uVar6 == 0) break;
                  local_8c0->ptr = sVar16;
                  lVar7 = 0;
                  if (uVar6 != 0) {
                    for (; (uVar6 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                    }
                  }
                  uVar9 = uVar6 - 1;
                }
              }
            }
          }
          else {
            iVar17 = 6;
          }
        } while (iVar17 == 0);
        if (iVar17 == 6) {
          iVar17 = 0;
          local_8a8 = (ulong)((uint)sVar16 & 0xf) - 8;
          bVar19 = local_8a8 != 0;
          if (bVar19) {
            local_8b0 = local_8b8->scene;
            uVar5 = 0;
            do {
              local_8a0.geomID = *(uint *)((sVar16 & 0xfffffffffffffff0) + uVar5 * 8);
              local_870 = (local_8b0->geometries).items[local_8a0.geomID].ptr;
              if ((ray->mask & local_870->mask) != 0) {
                local_8a0.primID = *(uint *)((sVar16 & 0xfffffffffffffff0) + 4 + uVar5 * 8);
                mask_1 = -1;
                local_8a0.valid = &mask_1;
                local_8a0.geometryUserPtr = local_870->userPtr;
                local_8a0.context = local_8b8->user;
                local_8a0.N = 1;
                local_868 = 0;
                local_860 = local_8b8->args;
                p_Var8 = local_860->intersect;
                if (p_Var8 == (RTCIntersectFunctionN)0x0) {
                  p_Var8 = (RTCIntersectFunctionN)
                           local_870[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                           ._M_i;
                }
                local_8a0.rayhit = (RTCRayHitN *)ray;
                (*p_Var8)(&local_8a0);
                auVar43 = ZEXT1664(local_7e8);
                auVar44 = ZEXT1664(local_7f8);
                auVar45 = ZEXT1664(local_808);
                auVar46 = ZEXT1664(local_818);
                auVar47 = ZEXT1664(local_828);
                auVar48 = ZEXT1664(local_838);
                auVar42 = ZEXT1664(local_848);
                auVar49 = ZEXT1664(local_858);
                if (ray->tfar < 0.0) {
                  uVar11 = local_8f0;
                  uVar12 = local_8c8;
                  uVar13 = local_8d0;
                  uVar14 = local_8d8;
                  uVar15 = local_8e0;
                  uVar18 = local_8e8;
                  if (bVar19) {
                    ray->tfar = -INFINITY;
                    iVar17 = 3;
                  }
                  break;
                }
              }
              uVar5 = uVar5 + 1;
              bVar19 = uVar5 < local_8a8;
              uVar11 = local_8f0;
              uVar12 = local_8c8;
              uVar13 = local_8d0;
              uVar14 = local_8d8;
              uVar15 = local_8e0;
              uVar18 = local_8e8;
            } while (uVar5 != local_8a8);
          }
        }
      } while (iVar17 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }